

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCancellationTest.cpp
# Opt level: O0

ValueType * anon_unknown.dwarf_67cc9::intToValue(ValueType *__return_storage_ptr__,int32_t value)

{
  uint uVar1;
  value_type vVar2;
  reference pvVar3;
  allocator<unsigned_char> local_16;
  undefined1 local_15;
  int32_t local_14;
  ValueType *pVStack_10;
  int32_t value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  
  local_15 = 0;
  local_14 = value;
  pVStack_10 = __return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_16);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,4,&local_16);
  std::allocator<unsigned_char>::~allocator(&local_16);
  vVar2 = (value_type)local_14;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,0);
  *pvVar3 = vVar2;
  uVar1 = (uint)local_14 >> 8;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,1);
  *pvVar3 = (value_type)uVar1;
  uVar1 = (uint)local_14 >> 0x10;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,2);
  *pvVar3 = (value_type)uVar1;
  uVar1 = (uint)local_14 >> 0x18;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (__return_storage_ptr__,3);
  *pvVar3 = (value_type)uVar1;
  return __return_storage_ptr__;
}

Assistant:

static core::ValueType intToValue(int32_t value) {
  std::vector<uint8_t> result(4);
  result[0] = (value >> 0) & 0xFF;
  result[1] = (value >> 8) & 0xFF;
  result[2] = (value >> 16) & 0xFF;
  result[3] = (value >> 24) & 0xFF;
  return result;
}